

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BottomLevelASBase.hpp
# Opt level: O1

bool __thiscall
Diligent::BottomLevelASBase<Diligent::EngineVkImplTraits>::CheckState
          (BottomLevelASBase<Diligent::EngineVkImplTraits> *this,RESOURCE_STATE State)

{
  string msg;
  string local_38;
  
  if ((State & State - RESOURCE_STATE_UNDEFINED) != RESOURCE_STATE_UNKNOWN) {
    FormatString<char[25]>(&local_38,(char (*) [25])"Single state is expected");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"CheckState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BottomLevelASBase.hpp"
               ,0xbf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->m_State == RESOURCE_STATE_UNKNOWN) {
    FormatString<char[22]>(&local_38,(char (*) [22])"BLAS state is unknown");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"CheckState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BottomLevelASBase.hpp"
               ,0xc0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return (State & ~this->m_State) == RESOURCE_STATE_UNKNOWN;
}

Assistant:

bool CheckState(RESOURCE_STATE State) const
    {
        DEV_CHECK_ERR((State & (State - 1)) == 0, "Single state is expected");
        DEV_CHECK_ERR(IsInKnownState(), "BLAS state is unknown");
        return (this->m_State & State) == State;
    }